

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_isBaseUnitImportReferenceUnresolved_Test::TestBody
          (Units_isBaseUnitImportReferenceUnresolved_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertionResult local_1f8 [2];
  AssertHelper local_1d8 [8];
  Message local_1d0 [15];
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_190 [8];
  Message local_188 [8];
  string local_180 [39];
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_128 [8];
  Message local_120 [15];
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_;
  string local_f8 [32];
  undefined1 local_d8 [8];
  ImportSourcePtr import;
  string local_c0 [32];
  undefined1 local_a0 [8];
  UnitsPtr u2;
  string local_88 [32];
  undefined1 local_68 [8];
  UnitsPtr u1;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ModelPtr model;
  Units_isBaseUnitImportReferenceUnresolved_Test *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::Model::create();
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"model",&local_41);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  libcellml::Units::create();
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"u",
             (allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::create();
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"some_other_u",
             (allocator<char> *)
             ((long)&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportSource::create();
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"I_am_a_url",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::ImportSource::setUrl((string *)peVar5);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_a0);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar4 + 0x10));
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d8);
  libcellml::ImportSource::setModel((shared_ptr *)peVar5);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_a0);
  bVar1 = libcellml::ImportedEntity::isImport();
  local_111 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_110,"u2->isImport()","false");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8db,pcVar6);
    testing::internal::AssertHelper::operator=(local_128,local_120);
    testing::internal::AssertHelper::~AssertHelper(local_128);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_a0);
  libcellml::ImportedEntity::importReference_abi_cxx11_();
  local_159 = (bool)std::__cxx11::string::empty();
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_158,&local_159,(type *)0x0);
  std::__cxx11::string::~string(local_180);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar2) {
    testing::Message::Message(local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_158,"u2->importReference().empty()",
               "false");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8dc,pcVar6);
    testing::internal::AssertHelper::operator=(local_190,local_188);
    testing::internal::AssertHelper::~AssertHelper(local_190);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_a0);
  bVar1 = libcellml::Units::isBaseUnit();
  local_1c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar2) {
    testing::Message::Message(local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_1f8,local_1c0,"u2->isBaseUnit()","true");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8dd,pcVar6);
    testing::internal::AssertHelper::operator=(local_1d8,local_1d0);
    testing::internal::AssertHelper::~AssertHelper(local_1d8);
    std::__cxx11::string::~string((string *)local_1f8);
    testing::Message::~Message(local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_d8);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_a0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_20);
  return;
}

Assistant:

TEST(Units, isBaseUnitImportReferenceUnresolved)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u");
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("some_other_u");

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    model->addUnits(u1);

    u2->setImportSource(import);
    import->setModel(model);

    EXPECT_TRUE(u2->isImport());
    EXPECT_TRUE(u2->importReference().empty());
    EXPECT_FALSE(u2->isBaseUnit());
}